

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O0

Event_handler * __thiscall
iqnet::Reactor<boost::mutex>::find_handler(Reactor<boost::mutex> *this,Handler fd)

{
  bool bVar1;
  pointer ppVar2;
  Event_handler *local_60;
  _Self local_48 [3];
  _Self local_30;
  h_iterator i;
  scoped_lock lk;
  Handler fd_local;
  Reactor<boost::mutex> *this_local;
  
  lk._12_4_ = fd;
  boost::unique_lock<boost::mutex>::unique_lock((unique_lock<boost::mutex> *)&i,&this->lock);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_iqnet::Event_handler_*,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
       ::find(&this->handlers,(key_type *)&lk.field_0xc);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_iqnet::Event_handler_*,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
       ::end(&this->handlers);
  bVar1 = std::operator==(&local_30,local_48);
  if (bVar1) {
    local_60 = (Event_handler *)0x0;
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_iqnet::Event_handler_*>_>::operator->
                       (&local_30);
    local_60 = ppVar2->second;
  }
  boost::unique_lock<boost::mutex>::~unique_lock((unique_lock<boost::mutex> *)&i);
  return local_60;
}

Assistant:

iqnet::Event_handler* Reactor<Lock>::find_handler(Socket::Handler fd)
{
  scoped_lock lk(lock);
  h_iterator i = handlers.find(fd);
  return i == handlers.end() ? NULL : i->second;
}